

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::SwapchainBuilder::SwapchainBuilder
          (SwapchainBuilder *this,VkPhysicalDevice physical_device,VkDevice device,
          VkSurfaceKHR surface,uint32_t graphics_queue_index,uint32_t present_queue_index)

{
  uint32_t uVar1;
  VulkanFunctions *pVVar2;
  VkPhysicalDevice_T **ts;
  undefined1 local_48 [8];
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_families;
  uint32_t present_queue_index_local;
  uint32_t graphics_queue_index_local;
  VkSurfaceKHR surface_local;
  VkDevice device_local;
  VkPhysicalDevice physical_device_local;
  SwapchainBuilder *this_local;
  
  queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = present_queue_index;
  queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = graphics_queue_index;
  device_local = (VkDevice)physical_device;
  physical_device_local = (VkPhysicalDevice)this;
  SwapchainInfo::SwapchainInfo(&this->info);
  (this->info).physical_device = (VkPhysicalDevice)device_local;
  (this->info).device = device;
  (this->info).surface = surface;
  (this->info).graphics_queue_index =
       queue_families.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._4_4_;
  ts = (VkPhysicalDevice_T **)
       (ulong)(uint32_t)
              queue_families.
              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->info).present_queue_index =
       (uint32_t)
       queue_families.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  if ((queue_families.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._4_4_ == 0xffffffff) ||
     ((uint32_t)
      queue_families.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == 0xffffffff)) {
    pVVar2 = detail::vulkan_functions();
    detail::
    get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*const&>
              ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)local_48
               ,(detail *)&pVVar2->fp_vkGetPhysicalDeviceQueueFamilyProperties,
               (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)
               &device_local,ts);
    if (queue_families.
        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0xffffffff) {
      uVar1 = detail::get_first_queue_index
                        ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          *)local_48,1);
      (this->info).graphics_queue_index = uVar1;
    }
    if ((uint32_t)
        queue_families.
        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage == 0xffffffff) {
      uVar1 = detail::get_present_queue_index
                        ((VkPhysicalDevice)device_local,surface,
                         (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          *)local_48);
      (this->info).present_queue_index = uVar1;
    }
    std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::~vector
              ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)local_48
              );
  }
  return;
}

Assistant:

SwapchainBuilder::SwapchainBuilder(VkPhysicalDevice const physical_device,
    VkDevice const device,
    VkSurfaceKHR const surface,
    uint32_t graphics_queue_index,
    uint32_t present_queue_index) {
    info.physical_device = physical_device;
    info.device = device;
    info.surface = surface;
    info.graphics_queue_index = graphics_queue_index;
    info.present_queue_index = present_queue_index;
    if (graphics_queue_index == detail::QUEUE_INDEX_MAX_VALUE || present_queue_index == detail::QUEUE_INDEX_MAX_VALUE) {
        auto queue_families = detail::get_vector_noerror<VkQueueFamilyProperties>(
            detail::vulkan_functions().fp_vkGetPhysicalDeviceQueueFamilyProperties, physical_device);
        if (graphics_queue_index == detail::QUEUE_INDEX_MAX_VALUE)
            info.graphics_queue_index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
        if (present_queue_index == detail::QUEUE_INDEX_MAX_VALUE)
            info.present_queue_index = detail::get_present_queue_index(physical_device, surface, queue_families);
    }
}